

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

int PrintAction(action *ap,FILE *fp,int indent)

{
  uint uVar1;
  char *pcVar2;
  undefined4 in_register_00000014;
  undefined8 uVar3;
  char *pcVar4;
  ulong uVar5;
  rule *rp;
  
  uVar3 = CONCAT44(in_register_00000014,indent);
  switch(ap->type) {
  case SHIFT:
    pcVar2 = ap->sp->name;
    uVar5 = (ulong)(uint)((ap->x).stp)->statenum;
    pcVar4 = "%*s shift        %-7d";
    break;
  case ACCEPT:
    pcVar2 = ap->sp->name;
    pcVar4 = "%*s accept";
    goto LAB_0010a613;
  case REDUCE:
    rp = (ap->x).rp;
    pcVar2 = ap->sp->name;
    uVar1 = rp->iRule;
    pcVar4 = "%*s reduce       %-7d";
    goto LAB_0010a634;
  case ERROR:
    pcVar2 = ap->sp->name;
    pcVar4 = "%*s error";
LAB_0010a613:
    fprintf((FILE *)fp,pcVar4,uVar3,pcVar2);
    return 1;
  case SSCONFLICT:
    pcVar2 = ap->sp->name;
    uVar5 = (ulong)(uint)((ap->x).stp)->statenum;
    pcVar4 = "%*s shift        %-7d ** Parsing conflict **";
    break;
  case SRCONFLICT:
  case RRCONFLICT:
    pcVar2 = ap->sp->name;
    uVar5 = (ulong)(uint)((ap->x).rp)->iRule;
    pcVar4 = "%*s reduce       %-7d ** Parsing conflict **";
    break;
  case SH_RESOLVED:
    if (showPrecedenceConflict == 0) {
      return 0;
    }
    pcVar2 = ap->sp->name;
    uVar5 = (ulong)(uint)((ap->x).stp)->statenum;
    pcVar4 = "%*s shift        %-7d -- dropped by precedence";
    break;
  case RD_RESOLVED:
    if (showPrecedenceConflict == 0) {
      return 0;
    }
    pcVar2 = ap->sp->name;
    uVar5 = (ulong)(uint)((ap->x).rp)->iRule;
    pcVar4 = "%*s reduce %-7d -- dropped by precedence";
    break;
  case NOT_USED:
    return 0;
  case SHIFTREDUCE:
    rp = (ap->x).rp;
    pcVar2 = ap->sp->name;
    uVar1 = rp->iRule;
    pcVar4 = "%*s shift-reduce %-7d";
LAB_0010a634:
    fprintf((FILE *)fp,pcVar4,uVar3,pcVar2,(ulong)uVar1);
    RulePrint(fp,rp,-1);
  default:
    goto switchD_0010a56c_default;
  }
  fprintf((FILE *)fp,pcVar4,uVar3,pcVar2,uVar5);
switchD_0010a56c_default:
  return 1;
}

Assistant:

int PrintAction(
  struct action *ap,          /* The action to print */
  FILE *fp,                   /* Print the action here */
  int indent                  /* Indent by this amount */
){
  int result = 1;
  switch( ap->type ){
    case SHIFT: {
      struct state *stp = ap->x.stp;
      fprintf(fp,"%*s shift        %-7d",indent,ap->sp->name,stp->statenum);
      break;
    }
    case REDUCE: {
      struct rule *rp = ap->x.rp;
      fprintf(fp,"%*s reduce       %-7d",indent,ap->sp->name,rp->iRule);
      RulePrint(fp, rp, -1);
      break;
    }
    case SHIFTREDUCE: {
      struct rule *rp = ap->x.rp;
      fprintf(fp,"%*s shift-reduce %-7d",indent,ap->sp->name,rp->iRule);
      RulePrint(fp, rp, -1);
      break;
    }
    case ACCEPT:
      fprintf(fp,"%*s accept",indent,ap->sp->name);
      break;
    case ERROR:
      fprintf(fp,"%*s error",indent,ap->sp->name);
      break;
    case SRCONFLICT:
    case RRCONFLICT:
      fprintf(fp,"%*s reduce       %-7d ** Parsing conflict **",
        indent,ap->sp->name,ap->x.rp->iRule);
      break;
    case SSCONFLICT:
      fprintf(fp,"%*s shift        %-7d ** Parsing conflict **", 
        indent,ap->sp->name,ap->x.stp->statenum);
      break;
    case SH_RESOLVED:
      if( showPrecedenceConflict ){
        fprintf(fp,"%*s shift        %-7d -- dropped by precedence",
                indent,ap->sp->name,ap->x.stp->statenum);
      }else{
        result = 0;
      }
      break;
    case RD_RESOLVED:
      if( showPrecedenceConflict ){
        fprintf(fp,"%*s reduce %-7d -- dropped by precedence",
                indent,ap->sp->name,ap->x.rp->iRule);
      }else{
        result = 0;
      }
      break;
    case NOT_USED:
      result = 0;
      break;
  }
  return result;
}